

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_isel(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 c2;
  uint uVar2;
  TCGv_i64 v1;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_extu_i32_i64_ppc64(tcg_ctx,ret,*(TCGv_i32 *)((long)cpu_crf + (ulong)(uVar1 >> 5 & 0x38)));
  tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,8L >> ((byte)uVar1 >> 6));
  c2 = tcg_const_i64_ppc64(tcg_ctx,0);
  uVar1 = ctx->opcode;
  uVar2 = uVar1 >> 0x10 & 0x1f;
  v1 = c2;
  if (uVar2 != 0) {
    v1 = cpu_gpr[uVar2];
  }
  tcg_gen_movcond_i64_ppc64
            (tcg_ctx,TCG_COND_NE,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)),ret,c2
             ,v1,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8)));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_isel(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t bi = rC(ctx->opcode);
    uint32_t mask = 0x08 >> (bi & 0x03);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv zr;

    tcg_gen_extu_i32_tl(tcg_ctx, t0, cpu_crf[bi >> 2]);
    tcg_gen_andi_tl(tcg_ctx, t0, t0, mask);

    zr = tcg_const_tl(tcg_ctx, 0);
    tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, cpu_gpr[rD(ctx->opcode)], t0, zr,
                       rA(ctx->opcode) ? cpu_gpr[rA(ctx->opcode)] : zr,
                       cpu_gpr[rB(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, zr);
    tcg_temp_free(tcg_ctx, t0);
}